

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void __thiscall
Js::InterpreterStackFrame::
OP_LdNewTarget<Js::OpLayoutT_Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  CallFlags flag;
  JavascriptFunction *pJVar1;
  unsigned_short localRegisterID;
  
  flag = *(CallFlags *)(this + 0x1c);
  if ((flag & CallFlags_NewTarget) == CallFlags_None) {
    localRegisterID = playout->R0;
    if ((flag & CallFlags_New) == CallFlags_None) {
      SetReg<unsigned_short>
                (this,localRegisterID,*(Var *)(*(long *)(*(long *)(this + 0x78) + 8) + 0x430));
      return;
    }
    pJVar1 = (JavascriptFunction *)(**(code **)(**(long **)(this + 0x80) + 0x3d0))();
    pJVar1 = StackScriptFunction::GetCurrentFunctionObject(pJVar1);
  }
  else {
    localRegisterID = playout->R0;
    pJVar1 = (JavascriptFunction *)
             CallInfo::GetNewTarget(flag,*(Var **)(this + 0x20),(uint)*(ushort *)(this + 0x18));
  }
  SetRegAllowStackVar<unsigned_short>(this,localRegisterID,pJVar1);
  return;
}

Assistant:

void InterpreterStackFrame::OP_LdNewTarget(const unaligned T* playout)
    {
        if (Js::CallInfo::HasNewTarget(this->m_callFlags))
        {
            SetRegAllowStackVar(playout->R0, (Js::RecyclableObject*)Js::CallInfo::GetNewTarget(this->m_callFlags, this->m_inParams, (ArgSlot)this->m_inSlotsCount));
        }
        else if (this->m_callFlags & CallFlags_New)
        {
            SetRegAllowStackVar(playout->R0, this->GetFunctionExpression());
        }
        else
        {
            SetReg(playout->R0, this->GetScriptContext()->GetLibrary()->GetUndefined());
        }
    }